

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  bool bVar1;
  type_t tVar2;
  xpath_node *pxVar3;
  size_t first;
  bool local_92;
  bool local_91;
  size_t size;
  xpath_node *it;
  xpath_node_set_raw s;
  bool once;
  type_t axis_type;
  bool axis_reverse;
  axis_t axis;
  nodeset_eval_t eval_local;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  if (this->_right == (xpath_ast_node *)0x0) {
    bVar1 = eval_once(type_sorted,eval);
    local_91 = true;
    if (bVar1) goto LAB_005139a1;
  }
  local_92 = false;
  if ((this->_right != (xpath_ast_node *)0x0) &&
     (local_92 = false, this->_right->_next == (xpath_ast_node *)0x0)) {
    local_92 = this->_right->_test == '\x03';
  }
  local_91 = local_92;
LAB_005139a1:
  s._eos._7_1_ = local_91;
  xpath_node_set_raw::xpath_node_set_raw(__return_storage_ptr__);
  xpath_node_set_raw::set_type(__return_storage_ptr__,type_sorted);
  if (this->_left == (xpath_ast_node *)0x0) {
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
              (this,__return_storage_ptr__,c,stack->result,s._eos._7_1_ & 1);
    if (this->_right != (xpath_ast_node *)0x0) {
      apply_predicates(this,__return_storage_ptr__,0,stack,eval);
    }
  }
  else {
    eval_node_set((xpath_node_set_raw *)&it,this->_left,c,stack,nodeset_eval_all);
    for (size = (size_t)xpath_node_set_raw::begin((xpath_node_set_raw *)&it);
        pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&it), (xpath_node *)size != pxVar3;
        size = size + 0x10) {
      first = xpath_node_set_raw::size(__return_storage_ptr__);
      if (first != 0) {
        xpath_node_set_raw::set_type(__return_storage_ptr__,type_unsorted);
      }
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                (this,__return_storage_ptr__,size,stack->result,s._eos._7_1_ & 1);
      if (this->_right != (xpath_ast_node *)0x0) {
        apply_predicates(this,__return_storage_ptr__,first,stack,eval);
      }
    }
  }
  tVar2 = xpath_node_set_raw::type(__return_storage_ptr__);
  if (tVar2 == type_unsorted) {
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_node_set_raw step_do(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_reverse = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_preceding || axis == axis_preceding_sibling);
			const xpath_node_set::type_t axis_type = axis_reverse ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

			bool once =
				(axis == axis_attribute && _test == nodetest_name) ||
				(!_right && eval_once(axis_type, eval)) ||
			    // coverity[mixed_enums]
				(_right && !_right->_next && _right->_test == predicate_constant_one);

			xpath_node_set_raw ns;
			ns.set_type(axis_type);

			if (_left)
			{
				xpath_node_set_raw s = _left->eval_node_set(c, stack, nodeset_eval_all);

				// self axis preserves the original order
				if (axis == axis_self) ns.set_type(s.type());

				for (const xpath_node* it = s.begin(); it != s.end(); ++it)
				{
					size_t size = ns.size();

					// in general, all axes generate elements in a particular order, but there is no order guarantee if axis is applied to two nodes
					if (axis != axis_self && size != 0) ns.set_type(xpath_node_set::type_unsorted);

					step_fill(ns, *it, stack.result, once, v);
					if (_right) apply_predicates(ns, size, stack, eval);
				}
			}
			else
			{
				step_fill(ns, c.n, stack.result, once, v);
				if (_right) apply_predicates(ns, 0, stack, eval);
			}

			// child, attribute and self axes always generate unique set of nodes
			// for other axis, if the set stayed sorted, it stayed unique because the traversal algorithms do not visit the same node twice
			if (axis != axis_child && axis != axis_attribute && axis != axis_self && ns.type() == xpath_node_set::type_unsorted)
				ns.remove_duplicates(stack.temp);

			return ns;
		}